

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

bool __thiscall BeliefSparse::SanityCheck(BeliefSparse *this)

{
  BS *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  BScit it;
  double local_40;
  long local_38;
  long local_30;
  long local_20;
  
  this_00 = &this->_m_b;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find(this_00,0);
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find(this_00,(this->_m_b).size_);
  if (local_30 == local_20) {
    auVar4 = ZEXT816(0xbff0000000000000);
  }
  else {
    local_40 = 0.0;
    do {
      dVar1 = *(double *)(*(long *)(local_38 + 0x40) + (local_30 - *(long *)(local_38 + 0x28)));
      if ((dVar1 < 0.0) || (1.000000000001 < dVar1)) goto LAB_003fb509;
      local_40 = local_40 + dVar1;
      local_30 = local_30 + 8;
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::find(this_00,this_00->size_);
    } while (local_30 != local_20);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40 + -1.0;
  }
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar4 = vandpd_avx512vl(auVar4,auVar2);
  if (auVar4._0_8_ <= 1e-12) {
    bVar3 = this_00->size_ != 0;
  }
  else {
LAB_003fb509:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool BeliefSparse::SanityCheck() const
{
    // check for negative and entries>1
    double sum=0;
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
    {
        if(*it<0)
            return(false);
        if(*it>1 + PROB_PRECISION)
            return(false);
        if(std::isnan(*it))
            return(false);
        sum+=*it;
    }

    // check if sums to 1
    if(abs(sum-1)>PROB_PRECISION)
        return(false);

    // check whether the size is not zero
    if(_m_b.size()==0)
        return(false);

    // if we haven't returned yet, the belief is fine
    return(true);
}